

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::loop<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  __optional_ne_t<wasm::Name,_wasm::Name> _Var2;
  size_t sVar3;
  Err *pEVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  Result<wasm::Ok> local_2e0;
  allocator<char> local_2b1;
  string local_2b0;
  Err local_290;
  undefined1 local_270 [8];
  optional<wasm::Name> id;
  string local_250;
  Err local_230;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  allocator<char> local_1f9;
  string local_1f8;
  Err local_1d8;
  Err local_1b8;
  Err *local_198;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined4 uStack_130;
  undefined1 local_120 [8];
  Result<wasm::Ok> _val_1;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  optional<wasm::Name> label;
  size_t pos;
  bool folded_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDeclsCtx *ctx_local;
  
  sVar3 = Lexer::getPos(&ctx->in);
  if (folded) {
    bVar5 = sv("loop",4);
    bVar1 = Lexer::takeSExprStart(&ctx->in,bVar5);
    if (!bVar1) goto LAB_02382b42;
  }
  if (!folded) {
    bVar5 = sv("loop",4);
    bVar1 = Lexer::takeKeyword(&ctx->in,bVar5);
    if (!bVar1) {
LAB_02382b42:
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  blocktype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
  Result<wasm::Ok>::Result
            ((Result<wasm::Ok> *)local_b8,(Result<wasm::Ok> *)__return_storage_ptr___00);
  local_d0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_b8);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_d0 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_f0,local_d0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_f0);
    wasm::Err::~Err(&local_f0);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_b8);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    Result<wasm::Ok>::operator*
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    uStack_130 = (undefined4)
                 label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len;
    NullInstrParserCtx::makeLoop<wasm::Ok>
              (local_120,(NullInstrParserCtx *)ctx,sVar3 & 0xffffffff,annotations,in_R8,in_R9,
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_4_,uStack_130,
               label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str
              );
    pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_120);
    if (pEVar4 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar4 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_120);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)&err_2,ctx);
      local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar1 = local_198 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_1b8,local_198);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1b8);
        wasm::Err::~Err(&local_1b8);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        if (folded) {
          bVar1 = Lexer::takeRParen(&ctx->in);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,"expected \')\' at end of loop",&local_1f9);
            Lexer::err(&local_1d8,&ctx->in,&local_1f8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1d8);
            wasm::Err::~Err(&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_023832e7;
          }
        }
        else {
          local_210 = sv("end",3);
          bVar1 = Lexer::takeKeyword(&ctx->in,local_210);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"expected \'end\' at end of loop",
                       (allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
            Lexer::err(&local_230,&ctx->in,&local_250);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_230);
            wasm::Err::~Err(&local_230);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_023832e7;
          }
          Lexer::takeID((optional<wasm::Name> *)local_270,&ctx->in);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_270);
          if ((bVar1) &&
             (_Var2 = std::operator!=((optional<wasm::Name> *)local_270,
                                      (optional<wasm::Name> *)
                                      ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)),
             _Var2)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,"end label does not match loop label",&local_2b1);
            Lexer::err(&local_290,&ctx->in,&local_2b0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_290);
            wasm::Err::~Err(&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator(&local_2b1);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_023832e7;
          }
        }
        NullInstrParserCtx::visitEnd(&local_2e0,(NullInstrParserCtx *)ctx);
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_2e0);
        Result<wasm::Ok>::~Result(&local_2e0);
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      }
    }
  }
LAB_023832e7:
  Result<wasm::Ok>::~Result
            ((Result<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
loop(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("loop"sv)) ||
      (!folded && !ctx.in.takeKeyword("loop"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeLoop(pos, annotations, label, *type));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of loop");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of loop");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match loop label");
    }
  }
  return ctx.visitEnd();
}